

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

void apply_yolo(yolo_layer *layer)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  float *x;
  yolo_layer *in_RDI;
  int index;
  int n;
  float *data;
  int N;
  int h;
  int w;
  int n_00;
  
  iVar1 = in_RDI->w;
  iVar2 = in_RDI->h;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->mask);
  x = std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x107fe1);
  for (n_00 = 0; n_00 < (int)sVar3; n_00 = n_00 + 1) {
    yolo_layer::entry_index(in_RDI,n_00 * iVar1 * iVar2,0);
    activate_array(x,n_00);
    yolo_layer::entry_index(in_RDI,n_00 * iVar1 * iVar2,4);
    activate_array(x,n_00);
  }
  return;
}

Assistant:

static void apply_yolo(yolo_layer & layer)
{
    int w = layer.w;
    int h = layer.h;
    int N = layer.mask.size();
    float * data = layer.predictions.data();
    for (int n = 0; n < N; n++) {
        int index = layer.entry_index(n*w*h, 0);
        activate_array(data + index, 2*w*h);
        index = layer.entry_index(n*w*h, 4);
        activate_array(data + index, (1+layer.classes)*w*h);
    }
}